

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::VariableDatum::SetDatumValue(VariableDatum *this,KOCTET *data,KUINT32 sizeInBits)

{
  ulong uVar1;
  pointer *ppDVar2;
  ulong uVar3;
  pointer pDVar4;
  iterator __position;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  DatumEntry de;
  DatumEntry local_40;
  KUINT32 local_34;
  
  pDVar4 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_v8DatumValue).
      super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
    (this->m_v8DatumValue).
    super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar4;
  }
  local_34 = sizeInBits;
  dVar8 = ceil((double)sizeInBits * 0.125);
  uVar7 = (uint)(long)dVar8;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      local_40.Buffer[0] = '\0';
      local_40.Buffer[1] = '\0';
      local_40.Buffer[2] = '\0';
      local_40.Buffer[3] = '\0';
      local_40.Buffer[4] = '\0';
      local_40.Buffer[5] = '\0';
      local_40.Buffer[6] = '\0';
      local_40.Buffer[7] = '\0';
      if ((uint)(uVar6 & 0xffff) < uVar7) {
        uVar5 = 0;
        do {
          uVar3 = (uVar6 & 0xffff) + uVar5;
          local_40.Buffer[uVar5] = data[uVar3 & 0xffff];
          uVar1 = uVar5 + 1;
          if (6 < uVar5) break;
          uVar5 = uVar1;
        } while (((int)uVar3 + 1U & 0xffff) < uVar7);
        uVar6 = (ulong)(uint)((int)uVar1 + (int)uVar6);
      }
      __position._M_current =
           (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_v8DatumValue).
          super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>>
        ::_M_realloc_insert<KDIS::DATA_TYPE::VariableDatum::DatumEntry_const&>
                  ((vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>>
                    *)&this->m_v8DatumValue,__position,&local_40);
      }
      else {
        *&(__position._M_current)->Buffer = local_40.Buffer;
        ppDVar2 = &(this->m_v8DatumValue).
                   super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar2 = *ppDVar2 + 1;
      }
    } while (((uint)uVar6 & 0xffff) < uVar7);
  }
  this->m_ui32DatumLength = local_34;
  return;
}

Assistant:

void VariableDatum::SetDatumValue( const KOCTET * data, KUINT32 sizeInBits )
{
    m_v8DatumValue.clear();

    KUINT32 sizeInOctets = ceil( sizeInBits / 8.0 );
    for( KUINT16 i = 0; i < sizeInOctets; )
    {
        DatumEntry de;

        for( KUINT16 j = 0; j < 8 && i < sizeInOctets; ++j, ++i )
        {
            de.Buffer[j] = data[i];
        }
        m_v8DatumValue.push_back( de );
    }

    m_ui32DatumLength = sizeInBits;
}